

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O1

void pnga_print_patch_file(FILE *file,Integer g_a,Integer *lo,Integer *hi,Integer pretty)

{
  float fVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  Integer *pIVar5;
  long *plVar6;
  Integer IVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  double *pdVar12;
  long lVar13;
  double *pdVar14;
  float *pfVar15;
  double *pdVar16;
  double *pdVar17;
  float *pfVar18;
  size_t __n;
  long lVar19;
  double *pdVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Integer ndim;
  Integer hip [7];
  Integer lop [7];
  Integer type;
  char *name;
  Integer ld [7];
  Integer dims [7];
  float fbuf [6];
  int ibuf [6];
  DoublePrecision dbuf_2d [36];
  longlong llbuf [6];
  long lbuf [6];
  DoublePrecision dbuf [6];
  DoublePrecision dcbuf [12];
  ulong local_a38;
  Integer local_a30;
  long local_a28 [8];
  long local_9e8 [8];
  ulong local_9a8;
  Integer *local_9a0;
  long local_998;
  long local_990;
  long local_988;
  char *local_980;
  long local_978;
  long *local_970;
  double *local_968;
  ulong local_960;
  double *local_958;
  double *local_950;
  double *local_948;
  double *local_940;
  Integer local_938;
  long alStack_930 [7];
  long local_8f8;
  ulong local_8f0;
  Integer local_8e8 [8];
  double local_8a8 [18];
  double local_818 [18];
  undefined8 local_788;
  double local_668 [36];
  double local_548 [36];
  undefined8 local_428;
  double local_278 [73];
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  pnga_sync();
  pnga_check_handle(g_a,"nga_print");
  IVar7 = pnga_nodeid();
  if (IVar7 == 0) {
    local_9a0 = lo;
    pnga_inquire(g_a,&local_998,(Integer *)&local_a38,local_8e8);
    pnga_inquire_name(g_a,&local_980);
    if (0 < (long)local_a38) {
      lVar10 = 0;
      do {
        if ((local_9a0[lVar10] < 1) || (local_8e8[lVar10] < hi[lVar10])) {
          pnga_error("g_a indices out of range ",g_a);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < (long)local_a38);
    }
    local_a30 = g_a;
    local_9a8 = pretty;
    fprintf((FILE *)file,"\n global array: %s[",local_980);
    pIVar5 = local_9a0;
    if (0 < (long)local_a38) {
      lVar10 = 0;
      do {
        pcVar11 = "%ld:%ld,";
        if (lVar10 == local_a38 - 1) {
          pcVar11 = "%ld:%ld";
        }
        fprintf((FILE *)file,pcVar11,pIVar5[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 < (long)local_a38);
    }
    fprintf((FILE *)file,"],  handle: %d \n",local_a30);
    pIVar5 = local_9a0;
    lVar10 = (ulong)(local_998 != 0x3ee) * 3;
    lVar19 = lVar10 + 3;
    if (0 < (long)local_a38) {
      lVar9 = local_a38 - 1;
      auVar22._8_4_ = (int)lVar9;
      auVar22._0_8_ = lVar9;
      auVar22._12_4_ = (int)((ulong)lVar9 >> 0x20);
      uVar8 = 0;
      auVar22 = auVar22 ^ _DAT_001b17c0;
      auVar24 = _DAT_001b17e0;
      do {
        auVar25 = auVar24 ^ _DAT_001b17c0;
        if ((bool)(~(auVar25._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar25._0_4_ ||
                    auVar22._4_4_ < auVar25._4_4_) & 1)) {
          alStack_930[uVar8 - 1] = lVar19;
        }
        if ((auVar25._12_4_ != auVar22._12_4_ || auVar25._8_4_ <= auVar22._8_4_) &&
            auVar25._12_4_ <= auVar22._12_4_) {
          alStack_930[uVar8] = lVar19;
        }
        uVar8 = uVar8 + 2;
        lVar9 = auVar24._8_8_;
        auVar24._0_8_ = auVar24._0_8_ + 2;
        auVar24._8_8_ = lVar9 + 2;
      } while ((local_a38 + 1 & 0xfffffffffffffffe) != uVar8);
    }
    local_978 = lVar19;
    local_970 = hi;
    if (local_9a8 == 0) {
      if (0 < (long)local_a38) {
        __n = local_a38 << 3;
        memcpy(local_9e8,local_9a0,__n);
        memcpy(local_a28,pIVar5,__n);
      }
      local_9a8 = lVar10 + 2;
      local_a28[0] = local_9e8[0] + local_9a8;
      if (*hi <= (long)(local_9e8[0] + local_9a8)) {
        local_a28[0] = *hi;
      }
      do {
        do {
          switch(local_998) {
          case 0x3e9:
            pdVar16 = local_818;
            break;
          case 0x3ea:
            pdVar16 = local_548;
            break;
          case 0x3eb:
            pdVar16 = local_8a8;
            break;
          case 0x3ec:
            pdVar16 = (double *)&local_428;
            break;
          default:
            pnga_error("ga_print: wrong type",0);
            goto LAB_0011ea0e;
          case 0x3ee:
            pdVar16 = (double *)&local_788;
            break;
          case 0x3ef:
            pdVar16 = local_278;
            break;
          case 0x3f8:
            pdVar16 = local_668;
          }
          pnga_get(local_a30,local_9e8,local_a28,pdVar16,&local_938);
LAB_0011ea0e:
          if (local_9e8[0] <= local_a28[0]) {
            lVar10 = 0;
            do {
              fprintf((FILE *)file,"%s(",local_980);
              if (0 < (long)local_a38) {
                lVar19 = 0;
                do {
                  if (local_a38 == 1 && lVar19 == 0) {
                    lVar9 = local_9e8[0] + lVar10;
LAB_0011ea8c:
                    pcVar11 = "%ld";
                  }
                  else {
                    if (lVar19 == local_a38 - 1 && lVar19 != 0) {
                      lVar9 = local_9e8[lVar19];
                      goto LAB_0011ea8c;
                    }
                    if (lVar19 == 0 && local_a38 != 1) {
                      lVar9 = local_9e8[0] + lVar10;
                    }
                    else {
                      lVar9 = local_9e8[lVar19];
                    }
                    pcVar11 = "%ld,";
                  }
                  fprintf((FILE *)file,pcVar11,lVar9);
                  lVar19 = lVar19 + 1;
                } while (lVar19 < (long)local_a38);
              }
              switch(local_998) {
              case 0x3e9:
                fprintf((FILE *)file,") = %d\n",(ulong)*(uint *)((long)local_818 + lVar10 * 4));
                break;
              case 0x3ea:
                dVar21 = local_548[lVar10];
                pcVar11 = ") = %ld\n";
                goto LAB_0011eb6c;
              case 0x3eb:
                dVar21 = (double)*(float *)((long)local_8a8 + lVar10 * 4);
LAB_0011eb9d:
                pcVar11 = ") = %f\n";
                goto LAB_0011ec1d;
              case 0x3ec:
                dVar21 = (double)(&local_428)[lVar10];
                if (dVar21 < 100000.0) goto LAB_0011eb9d;
                pcVar11 = ") = %e\n";
LAB_0011ec1d:
                fprintf((FILE *)file,pcVar11,dVar21);
                break;
              case 0x3ee:
                dVar21 = (double)*(float *)(&local_788 + lVar10);
                if ((100000.0 <= *(float *)(&local_788 + lVar10)) ||
                   (fVar1 = *(float *)((long)&local_788 + lVar10 * 8 + 4), 100000.0 <= fVar1)) {
                  dVar23 = (double)*(float *)((long)&local_788 + lVar10 * 8 + 4);
                  goto LAB_0011ec00;
                }
                dVar23 = (double)fVar1;
LAB_0011ebe8:
                pcVar11 = ") = (%f,%f)\n";
                goto LAB_0011ec0a;
              case 0x3ef:
                dVar21 = local_278[lVar10 * 2];
                if ((dVar21 < 100000.0) && (dVar23 = local_278[lVar10 * 2 + 1], dVar23 < 100000.0))
                goto LAB_0011ebe8;
                dVar23 = local_278[lVar10 * 2 + 1];
LAB_0011ec00:
                pcVar11 = ") = (%e,%e)\n";
LAB_0011ec0a:
                fprintf((FILE *)file,pcVar11,dVar21,dVar23);
                break;
              case 0x3f8:
                dVar21 = local_668[lVar10];
                pcVar11 = ") = %lld\n";
LAB_0011eb6c:
                fprintf((FILE *)file,pcVar11,dVar21);
              }
              bVar3 = lVar10 < local_a28[0] - local_9e8[0];
              lVar10 = lVar10 + 1;
            } while (bVar3);
          }
          fflush((FILE *)file);
          plVar6 = local_970;
          local_9e8[0] = local_a28[0] + 1;
          local_a28[0] = local_a28[0] + local_978;
          if (*local_970 <= local_a28[0]) {
            local_a28[0] = *local_970;
          }
        } while ((long)local_a38 < 1);
        bVar3 = true;
        uVar8 = 0;
        do {
          lVar10 = plVar6[uVar8];
          if (lVar10 < local_9e8[uVar8]) {
            if (local_a38 - 1 == uVar8) {
              bVar3 = false;
            }
            else {
              lVar19 = local_9a0[uVar8];
              local_9e8[uVar8] = lVar19;
              if (uVar8 == 0) {
                local_a28[0] = lVar19 + local_9a8;
                if (lVar10 <= (long)(lVar19 + local_9a8)) {
                  local_a28[0] = lVar10;
                }
              }
              else {
                local_a28[uVar8] = lVar19;
              }
              local_9e8[uVar8 + 1] = local_9e8[uVar8 + 1] + 1;
              local_a28[uVar8 + 1] = local_a28[uVar8 + 1] + 1;
            }
          }
          uVar8 = uVar8 + 1;
        } while (local_a38 != uVar8);
      } while (bVar3);
    }
    else {
      if (0 < (long)local_a38) {
        uVar8 = 0;
        do {
          lVar9 = pIVar5[uVar8];
          local_9e8[uVar8] = lVar9;
          if (uVar8 < 2) {
            lVar9 = lVar9 + lVar10 + 2;
            if (hi[uVar8] <= lVar9) {
              lVar9 = hi[uVar8];
            }
          }
          local_a28[uVar8] = lVar9;
          uVar8 = uVar8 + 1;
        } while (local_a38 != uVar8);
      }
      local_8f8 = lVar10 + 2;
      iVar4 = (int)lVar19;
      local_9a8 = (ulong)(uint)(iVar4 * 8);
      local_8f0 = (ulong)(uint)(iVar4 << 4);
      local_960 = (ulong)(uint)(iVar4 * 4);
      lVar10 = 1;
      local_988 = 1;
      do {
        pIVar5 = local_9a0;
        IVar7 = local_a30;
        local_990 = lVar10;
        if ((lVar10 != 0) && (2 < (long)local_a38)) {
          fprintf((FILE *)file,"\n -- patch: %s[",local_980);
          if (0 < (long)local_a38) {
            uVar8 = 0;
            do {
              if (uVar8 < 2) {
                if (uVar8 == local_a38 - 1) {
                  pcVar11 = "%ld:%ld";
                }
                else {
                  pcVar11 = "%ld:%ld,";
                }
                fprintf((FILE *)file,pcVar11,pIVar5[uVar8],hi[uVar8]);
              }
              else {
                if (uVar8 == local_a38 - 1) {
                  pcVar11 = "%ld";
                }
                else {
                  pcVar11 = "%ld,";
                }
                fprintf((FILE *)file,pcVar11,local_9e8[uVar8]);
              }
              uVar8 = uVar8 + 1;
            } while ((long)uVar8 < (long)local_a38);
          }
          fwrite("]\n",2,1,(FILE *)file);
          local_990 = 0;
        }
        if ((local_988 != 0) && (1 < (long)local_a38)) {
          fputc(10,(FILE *)file);
          switch(local_998) {
          case 0x3e9:
            fwrite("     ",5,1,(FILE *)file);
            lVar10 = local_9e8[1];
            if (local_9e8[1] <= local_a28[1]) {
              do {
                fprintf((FILE *)file,"%7ld  ",lVar10);
                bVar3 = lVar10 < local_a28[1];
                lVar10 = lVar10 + 1;
              } while (bVar3);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            if (local_9e8[1] <= local_a28[1]) {
              lVar10 = local_9e8[1] + -1;
              do {
                fwrite(" --------",9,1,(FILE *)file);
                lVar10 = lVar10 + 1;
              } while (lVar10 < local_a28[1]);
            }
            break;
          case 0x3ea:
            fwrite("     ",5,1,(FILE *)file);
            lVar10 = local_9e8[1];
            if (local_9e8[1] <= local_a28[1]) {
              do {
                fprintf((FILE *)file,"%7ld  ",lVar10);
                bVar3 = lVar10 < local_a28[1];
                lVar10 = lVar10 + 1;
              } while (bVar3);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            if (local_9e8[1] <= local_a28[1]) {
              lVar10 = local_9e8[1] + -1;
              do {
                fwrite(" --------",9,1,(FILE *)file);
                lVar10 = lVar10 + 1;
              } while (lVar10 < local_a28[1]);
            }
            break;
          case 0x3eb:
            fwrite("     ",5,1,(FILE *)file);
            lVar10 = local_9e8[1];
            if (local_9e8[1] <= local_a28[1]) {
              do {
                fprintf((FILE *)file,"%7ld  ",lVar10);
                bVar3 = lVar10 < local_a28[1];
                lVar10 = lVar10 + 1;
              } while (bVar3);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            if (local_9e8[1] <= local_a28[1]) {
              lVar10 = local_9e8[1] + -1;
              do {
                fwrite(" --------",9,1,(FILE *)file);
                lVar10 = lVar10 + 1;
              } while (lVar10 < local_a28[1]);
            }
            break;
          case 0x3ec:
            fwrite("   ",3,1,(FILE *)file);
            lVar10 = local_9e8[1];
            if (local_9e8[1] <= local_a28[1]) {
              do {
                fprintf((FILE *)file,"%10ld  ",lVar10);
                bVar3 = lVar10 < local_a28[1];
                lVar10 = lVar10 + 1;
              } while (bVar3);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            if (local_9e8[1] <= local_a28[1]) {
              lVar10 = local_9e8[1] + -1;
              do {
                fwrite(" -----------",0xc,1,(FILE *)file);
                lVar10 = lVar10 + 1;
              } while (lVar10 < local_a28[1]);
            }
            break;
          default:
            pnga_error("ga_print: wrong type",0);
            break;
          case 0x3ee:
            lVar10 = local_9e8[1];
            if (local_9e8[1] <= local_a28[1]) {
              do {
                fprintf((FILE *)file,"%22ld  ",lVar10);
                bVar3 = lVar10 < local_a28[1];
                lVar10 = lVar10 + 1;
              } while (bVar3);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            if (local_9e8[1] <= local_a28[1]) {
              lVar10 = local_9e8[1] + -1;
              do {
                fwrite(" -----------------------",0x18,1,(FILE *)file);
                lVar10 = lVar10 + 1;
              } while (lVar10 < local_a28[1]);
            }
            break;
          case 0x3ef:
            lVar10 = local_9e8[1];
            if (local_9e8[1] <= local_a28[1]) {
              do {
                fprintf((FILE *)file,"%22ld  ",lVar10);
                bVar3 = lVar10 < local_a28[1];
                lVar10 = lVar10 + 1;
              } while (bVar3);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            if (local_9e8[1] <= local_a28[1]) {
              lVar10 = local_9e8[1] + -1;
              do {
                fwrite(" -----------------------",0x18,1,(FILE *)file);
                lVar10 = lVar10 + 1;
              } while (lVar10 < local_a28[1]);
            }
            break;
          case 0x3f8:
            fwrite("     ",5,1,(FILE *)file);
            lVar10 = local_9e8[1];
            if (local_9e8[1] <= local_a28[1]) {
              do {
                fprintf((FILE *)file,"%7ld  ",lVar10);
                bVar3 = lVar10 < local_a28[1];
                lVar10 = lVar10 + 1;
              } while (bVar3);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            if (local_9e8[1] <= local_a28[1]) {
              lVar10 = local_9e8[1] + -1;
              do {
                fwrite(" --------",9,1,(FILE *)file);
                lVar10 = lVar10 + 1;
              } while (lVar10 < local_a28[1]);
            }
          }
          fputc(10,(FILE *)file);
          local_988 = 0;
        }
        switch(local_998) {
        case 0x3e9:
          pdVar16 = local_818;
          break;
        case 0x3ea:
          pdVar16 = local_548;
          break;
        case 0x3eb:
          pdVar16 = local_8a8;
          break;
        case 0x3ec:
          pdVar16 = (double *)&local_788;
          break;
        default:
          pnga_error("ga_print: wrong type",0);
          goto LAB_0011e215;
        case 0x3ee:
          pdVar16 = (double *)&local_428;
          break;
        case 0x3ef:
          pdVar16 = local_278;
          break;
        case 0x3f8:
          pdVar16 = local_668;
        }
        pnga_get(IVar7,local_9e8,local_a28,pdVar16,&local_938);
LAB_0011e215:
        if (local_9e8[0] <= local_a28[0]) {
          pdVar16 = local_818;
          local_968 = local_548;
          pdVar17 = local_668;
          pdVar12 = (double *)&local_788;
          pdVar14 = local_8a8;
          pdVar20 = local_278 + 1;
          pfVar15 = (float *)((long)&local_428 + 4);
          lVar10 = 0;
          do {
            local_958 = pdVar14;
            local_950 = pdVar12;
            fprintf((FILE *)file,"%4ld  ",local_9e8[0] + lVar10);
            local_940 = pdVar16;
            local_948 = pdVar17;
            switch(local_998) {
            case 0x3e9:
              if ((long)local_a38 < 2) {
                fprintf((FILE *)file," %8d",(ulong)*(uint *)((long)local_818 + lVar10 * 4));
              }
              else if (local_9e8[1] <= local_a28[1]) {
                lVar19 = -1;
                do {
                  fprintf((FILE *)file," %8d",(ulong)*(uint *)pdVar16);
                  lVar19 = lVar19 + 1;
                  pdVar16 = (double *)((long)pdVar16 + local_960);
                } while (lVar19 < local_a28[1] - local_9e8[1]);
              }
              break;
            case 0x3ea:
              if ((long)local_a38 < 2) {
                dVar21 = local_548[lVar10];
                pcVar11 = " %8ld";
LAB_0011e67c:
                fprintf((FILE *)file,pcVar11,dVar21);
              }
              else if (local_9e8[1] <= local_a28[1]) {
                lVar19 = -1;
                pdVar16 = local_968;
                do {
                  fprintf((FILE *)file," %8ld",*pdVar16);
                  lVar19 = lVar19 + 1;
                  pdVar16 = (double *)((long)pdVar16 + local_9a8);
                } while (lVar19 < local_a28[1] - local_9e8[1]);
              }
              break;
            case 0x3eb:
              if ((long)local_a38 < 2) {
                dVar21 = (double)*(float *)((long)local_8a8 + lVar10 * 4);
LAB_0011e6ad:
                pcVar11 = " %11.5f";
LAB_0011e72d:
                fprintf((FILE *)file,pcVar11,dVar21);
              }
              else if (local_9e8[1] <= local_a28[1]) {
                lVar19 = -1;
                pdVar16 = local_958;
                do {
                  fprintf((FILE *)file," %11.5f",(double)*(float *)pdVar16);
                  lVar19 = lVar19 + 1;
                  pdVar16 = (double *)((long)pdVar16 + local_960);
                } while (lVar19 < local_a28[1] - local_9e8[1]);
              }
              break;
            case 0x3ec:
              if ((long)local_a38 < 2) {
                dVar21 = (double)(&local_788)[lVar10];
                if (dVar21 < 100000.0) goto LAB_0011e6ad;
                pcVar11 = " %.5e";
                goto LAB_0011e72d;
              }
              if (local_9e8[1] <= local_a28[1]) {
                lVar19 = -1;
                pdVar16 = local_950;
                do {
                  pcVar11 = " %11.5f";
                  if (100000.0 <= *pdVar16) {
                    pcVar11 = " %.5e";
                  }
                  fprintf((FILE *)file,pcVar11);
                  lVar19 = lVar19 + 1;
                  pdVar16 = (double *)((long)pdVar16 + local_9a8);
                } while (lVar19 < local_a28[1] - local_9e8[1]);
              }
              break;
            default:
              pnga_error("ga_print: wrong data type",0);
              break;
            case 0x3ee:
              if ((long)local_a38 < 2) {
                dVar21 = (double)*(float *)(&local_428 + lVar10);
                if ((100000.0 <= *(float *)(&local_428 + lVar10)) ||
                   (fVar1 = *(float *)((long)&local_428 + lVar10 * 8 + 4), 100000.0 <= fVar1)) {
                  dVar23 = (double)*(float *)((long)&local_428 + lVar10 * 8 + 4);
                  goto LAB_0011e710;
                }
                dVar23 = (double)fVar1;
LAB_0011e6f8:
                pcVar11 = " %11.5f,%11.5f";
LAB_0011e71a:
                fprintf((FILE *)file,pcVar11,dVar21,dVar23);
              }
              else if (local_9e8[1] <= local_a28[1]) {
                lVar19 = -1;
                pfVar18 = pfVar15;
                do {
                  if (100000.0 <= pfVar18[-1]) {
LAB_0011e5ac:
                    fVar1 = *pfVar18;
                    pcVar11 = " %.5e,%.5e";
                  }
                  else {
                    fVar1 = *pfVar18;
                    pcVar11 = " %11.5f,%11.5f";
                    if (100000.0 <= fVar1) goto LAB_0011e5ac;
                  }
                  fprintf((FILE *)file,pcVar11,(double)pfVar18[-1],(double)fVar1);
                  lVar19 = lVar19 + 1;
                  pfVar18 = (float *)((long)pfVar18 + local_9a8);
                } while (lVar19 < local_a28[1] - local_9e8[1]);
              }
              break;
            case 0x3ef:
              if ((long)local_a38 < 2) {
                dVar21 = local_278[lVar10 * 2];
                if ((dVar21 < 100000.0) && (dVar23 = local_278[lVar10 * 2 + 1], dVar23 < 100000.0))
                goto LAB_0011e6f8;
                dVar23 = local_278[lVar10 * 2 + 1];
LAB_0011e710:
                pcVar11 = " %.5e,%.5e";
                goto LAB_0011e71a;
              }
              if (local_9e8[1] <= local_a28[1]) {
                lVar19 = -1;
                pdVar16 = pdVar20;
                do {
                  if ((100000.0 <= pdVar16[-1]) || (100000.0 <= *pdVar16)) {
                    pcVar11 = " %.5e,%.5e";
                  }
                  else {
                    pcVar11 = " %11.5f,%11.5f";
                  }
                  fprintf((FILE *)file,pcVar11);
                  lVar19 = lVar19 + 1;
                  pdVar16 = (double *)((long)pdVar16 + local_8f0);
                } while (lVar19 < local_a28[1] - local_9e8[1]);
              }
              break;
            case 0x3f8:
              if ((long)local_a38 < 2) {
                dVar21 = local_668[lVar10];
                pcVar11 = " %8lld";
                goto LAB_0011e67c;
              }
              if (local_9e8[1] <= local_a28[1]) {
                lVar19 = -1;
                do {
                  fprintf((FILE *)file," %8lld",*pdVar17);
                  lVar19 = lVar19 + 1;
                  pdVar17 = (double *)((long)pdVar17 + local_9a8);
                } while (lVar19 < local_a28[1] - local_9e8[1]);
              }
            }
            fputc(10,(FILE *)file);
            pfVar15 = pfVar15 + 2;
            pdVar20 = pdVar20 + 2;
            pdVar14 = (double *)((long)local_958 + 4);
            pdVar12 = local_950 + 1;
            pdVar17 = local_948 + 1;
            local_968 = local_968 + 1;
            pdVar16 = (double *)((long)local_940 + 4);
            bVar3 = lVar10 < local_a28[0] - local_9e8[0];
            lVar10 = lVar10 + 1;
          } while (bVar3);
        }
        lVar9 = local_8f8;
        hi = local_970;
        lVar19 = local_978;
        pIVar5 = local_9a0;
        local_9e8[0] = local_a28[0] + 1;
        local_a28[0] = local_a28[0] + local_978;
        if (*local_970 <= local_a28[0]) {
          local_a28[0] = *local_970;
        }
        lVar10 = local_990;
        if ((long)local_a38 < 1) {
          bVar3 = false;
        }
        else {
          bVar3 = true;
          uVar8 = 0;
          do {
            lVar13 = hi[uVar8];
            if (lVar13 < local_9e8[uVar8]) {
              if (local_a38 - 1 == uVar8) {
                bVar3 = false;
              }
              else {
                lVar2 = pIVar5[uVar8];
                local_9e8[uVar8] = lVar2;
                if (lVar9 + lVar2 < lVar13) {
                  lVar13 = lVar9 + lVar2;
                }
                if (1 < uVar8) {
                  lVar13 = lVar2;
                }
                local_a28[uVar8] = lVar13;
                if (uVar8 == 0) {
                  local_9e8[1] = local_a28[1] + 1;
                  lVar13 = local_a28[1] + lVar19;
                  if (hi[1] <= local_a28[1] + lVar19) {
                    lVar13 = hi[1];
                  }
                  local_a28[1] = lVar13;
                  local_988 = 1;
                }
                else {
                  local_9e8[uVar8 + 1] = local_9e8[uVar8 + 1] + 1;
                  local_a28[uVar8 + 1] = local_a28[uVar8 + 1] + 1;
                }
                if (uVar8 == 1) {
                  lVar10 = 1;
                }
              }
            }
            uVar8 = uVar8 + 1;
          } while (local_a38 != uVar8);
          bVar3 = !bVar3;
        }
      } while (!bVar3);
    }
    fflush((FILE *)file);
  }
  pnga_sync();
  return;
}

Assistant:

void pnga_print_patch_file(file, g_a, lo, hi, pretty)
        Integer g_a, *lo, *hi, pretty;
        FILE *file;
/*
  Pretty = 0 ... spew output out with no formatting
  Pretty = 1 ... format output so that it is readable
*/  
{
#define BUFSIZE 6
#define FLEN 80 

    Integer i, j;
    Integer type;
    char *name;
    Integer ndim, dims[MAXDIM], ld[MAXDIM];
    Integer bufsize;
    int ibuf[BUFSIZE], ibuf_2d[BUFSIZE*BUFSIZE];
    DoublePrecision dbuf[BUFSIZE], dbuf_2d[BUFSIZE*BUFSIZE];
    DoublePrecision dcbuf[2*BUFSIZE], dcbuf_2d[2*BUFSIZE*BUFSIZE];
    float fbuf[BUFSIZE], fbuf_2d[BUFSIZE*BUFSIZE];
    float fcbuf[2*BUFSIZE], fcbuf_2d[3*BUFSIZE*BUFSIZE];
    Integer lop[MAXDIM], hip[MAXDIM];
    long lbuf[BUFSIZE], lbuf_2d[BUFSIZE*BUFSIZE];
    long long llbuf[BUFSIZE], llbuf_2d[BUFSIZE*BUFSIZE];
    Integer done, status_2d, status_3d;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    pnga_sync();
    pnga_check_handle(g_a, "nga_print");

    /* only the first process print the array */
    if(pnga_nodeid() == 0) {
        
        pnga_inquire(g_a,  &type, &ndim, dims);
        pnga_inquire_name(g_a, &name);
        
        /* check the boundary */
        for(i=0; i<ndim; i++)
            if(lo[i] <= 0 || hi[i] > dims[i]) 
                pnga_error("g_a indices out of range ", g_a);
        
        /* print the general information */
        fprintf(file,"\n global array: %s[", name);
        for(i=0; i<ndim; i++)
            if(i != (ndim-1))
                fprintf(file, "%ld:%ld,", (long)lo[i], (long)hi[i]);
            else
                fprintf(file, "%ld:%ld",  (long)lo[i], (long)hi[i]);
        fprintf(file,"],  handle: %d \n", (int)g_a);
        
        bufsize = (type==C_DCPL)? BUFSIZE/2 : BUFSIZE;
        bufsize = (type==C_SCPL)? BUFSIZE/2 : BUFSIZE;
        
        for(i=0; i<ndim; i++) ld[i] = bufsize;
        
        if(!pretty) {
            done = 1;
            for(i=0; i<ndim; i++) {
                lop[i] = lo[i]; hip[i] = lo[i];
            }
            hip[0] = GA_MIN(lop[0]+bufsize-1, hi[0]);
            while(done) {
                switch(type) {
                    case C_INT:      pnga_get(g_a, lop, hip, ibuf, ld); break;
                    case C_DBL:      pnga_get(g_a, lop, hip, dbuf, ld); break;
                    case C_DCPL:     pnga_get(g_a, lop, hip, dcbuf, ld); break;
                    case C_FLOAT:    pnga_get(g_a, lop, hip, fbuf, ld); break; 
                    case C_SCPL:     pnga_get(g_a, lop, hip, fcbuf, ld); break;
                    case C_LONG:     pnga_get(g_a, lop, hip, lbuf, ld); break; 
                    case C_LONGLONG: pnga_get(g_a, lop, hip, llbuf,ld); break;
                    default: pnga_error("ga_print: wrong type",0);
                }
                
                /* print the array */
                for(i=0; i<(hip[0]-lop[0]+1); i++) {
                    fprintf(file,"%s(", name);
                    for(j=0; j<ndim; j++)
                        if((j == 0) && (j == (ndim-1)))
                            fprintf(file, "%ld", (long)lop[j]+i);
                        else if((j != 0) && (j == (ndim-1)))
                            fprintf(file, "%ld", (long)lop[j]);
                        else if((j == 0) && (j != (ndim-1)))
                            fprintf(file, "%ld,", (long)lop[j]+i);
                        else fprintf(file, "%ld,", (long)lop[j]);
                    switch(type) {
                        case C_INT:
                            fprintf(file,") = %d\n", ibuf[i]);break;
                        case C_LONG:
                            fprintf(file,") = %ld\n", lbuf[i]);break;
                        case C_LONGLONG:
                            fprintf(file,") = %lld\n", llbuf[i]);break;
                        case C_DBL:
                            if((double)dbuf[i]<100000.0)
                                fprintf(file,") = %f\n", dbuf[i]);
                            else fprintf(file,") = %e\n", dbuf[i]);
                            break;
                        case C_DCPL:
                            if(((double)dcbuf[i*2]<100000.0) &&
                               ((double)dcbuf[i*2+1]<100000.0))
                                fprintf(file,") = (%f,%f)\n",
                                        dcbuf[i*2],dcbuf[i*2+1]);
                            else
                                fprintf(file,") = (%e,%e)\n",
                                        dcbuf[i*2],dcbuf[i*2+1]);
                            break;
                        case C_SCPL:
                            if(((float)fcbuf[i*2]<100000.0) &&
                               ((float)fcbuf[i*2+1]<100000.0))
                                fprintf(file,") = (%f,%f)\n",
                                        fcbuf[i*2],fcbuf[i*2+1]);
                            else
                                fprintf(file,") = (%e,%e)\n",
                                        fcbuf[i*2],fcbuf[i*2+1]);
                            break;
                        case C_FLOAT: fprintf(file,") = %f\n", fbuf[i]);break; 
                    }
                }
                
                fflush(file);
                
                lop[0] = hip[0]+1; hip[0] = GA_MIN(lop[0]+bufsize-1, hi[0]);
                
                for(i=0; i<ndim; i++) {
                    if(lop[i] > hi[i]) {
                        if(i == (ndim-1)) {
                            done = 0;
                        } else {
                            lop[i] = lo[i];
                            if(i == 0) hip[i] = GA_MIN(lop[i]+bufsize-1, hi[i]);
                            else hip[i] = lo[i];
                            lop[i+1]++; hip[i+1]++;
                        }
                    }
                }
            }
        }
        else {
            /* pretty print */
            done = 1;
            for(i=0; i<ndim; i++) {
                lop[i] = lo[i];
                if((i == 0) || (i == 1))
                    hip[i] = GA_MIN(lop[i]+bufsize-1, hi[i]);
                else 
                    hip[i] = lo[i];
            }
            
            status_2d = 1; status_3d = 1;
            
            while(done) {
                if(status_3d && (ndim > 2)) { /* print the patch info */
                    fprintf(file,"\n -- patch: %s[", name);
                    for(i=0; i<ndim; i++)
                        if(i < 2)
                            if(i != (ndim-1))
                                fprintf(file, "%ld:%ld,", (long)lo[i], (long)hi[i]);
                            else
                                fprintf(file, "%ld:%ld", (long)lo[i], (long)hi[i]);
                        else
                            if(i != (ndim-1))
                                fprintf(file, "%ld,", (long)lop[i]);
                            else
                                fprintf(file, "%ld", (long)lop[i]);
                    fprintf(file,"]\n"); status_3d = 0;
                }
                
                if(status_2d &&(ndim > 1)) {
                    fprintf(file, "\n"); 
                    switch(type) {
                        case C_INT:
                            fprintf(file, "     ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%7ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," --------");
                            break;
                        case C_LONG:
                            fprintf(file, "     ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%7ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," --------");
                            break;
                        case C_LONGLONG:
                            fprintf(file, "     ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%7ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," --------");
                            break;
                        case C_DBL:
                            fprintf(file, "   ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%10ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," -----------");
                            break;
                        case C_DCPL:
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%22ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," -----------------------");
                            break;
                        case C_SCPL:
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%22ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," -----------------------");
                            break;
                        case C_FLOAT:
                            fprintf(file, "     ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%7ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," --------");
                            break;
                       default:
                         pnga_error("ga_print: wrong type", 0);
                    }
                    
                    fprintf(file,"\n");
                    status_2d = 0;
                }
                
                switch(type) {
                    case C_INT: pnga_get(g_a, lop, hip, ibuf_2d, ld); break;
                    case C_LONG: pnga_get(g_a, lop, hip,lbuf_2d, ld); break;
                    case C_LONGLONG: pnga_get(g_a, lop, hip,llbuf_2d,ld);break;
                    case C_DBL: pnga_get(g_a, lop, hip, dbuf_2d, ld); break;
                    case C_DCPL: pnga_get(g_a, lop, hip, dcbuf_2d, ld);break;
                    case C_FLOAT: pnga_get(g_a, lop, hip, fbuf_2d, ld);break;
                    case C_SCPL: pnga_get(g_a, lop, hip, fcbuf_2d, ld);break;  
                   default: pnga_error("ga_print: wrong type",0);
                }
                
                for(i=0; i<(hip[0]-lop[0]+1); i++) {
                    fprintf(file,"%4ld  ", (long)(lop[0]+i));
                    switch(type) {
                        case C_INT:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    fprintf(file," %8d", ibuf_2d[j*bufsize+i]);
                            else fprintf(file," %8d", ibuf_2d[i]);
                            break;
                        case C_LONG:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    fprintf(file," %8ld",lbuf_2d[j*bufsize+i]);
                            else fprintf(file," %8ld",lbuf_2d[i]);
                            break;
                        case C_LONGLONG:
                            if(ndim > 1)
                               for(j=0; j<(hip[1]-lop[1]+1); j++)
                                  fprintf(file," %8lld",llbuf_2d[j*bufsize+i]);
                            else fprintf(file," %8lld",llbuf_2d[i]);
                            break;
                        case C_DBL:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    if((double)dbuf_2d[j*bufsize+i]<100000.0)
                                        fprintf(file," %11.5f",
                                                dbuf_2d[j*bufsize+i]);
                                    else
                                        fprintf(file," %.5e",
                                                dbuf_2d[j*bufsize+i]);
                            else
                                if((double)dbuf_2d[i]<100000.0)
                                    fprintf(file," %11.5f",dbuf_2d[i]);
                                else
                                    fprintf(file," %.5e",dbuf_2d[i]);
                            break;
                        case C_FLOAT:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    fprintf(file," %11.5f", fbuf_2d[j*bufsize+i]);
                            else fprintf(file," %11.5f", fbuf_2d[i]);
                            break;           
                        case C_DCPL:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    if(((double)dcbuf_2d[(j*bufsize+i)*2]<100000.0)&&((double)dcbuf_2d[(j*bufsize+i)*2+1]<100000.0))
                                        fprintf(file," %11.5f,%11.5f",
                                                dcbuf_2d[(j*bufsize+i)*2],
                                                dcbuf_2d[(j*bufsize+i)*2+1]);
                                    else
                                        fprintf(file," %.5e,%.5e",
                                                dcbuf_2d[(j*bufsize+i)*2],
                                                dcbuf_2d[(j*bufsize+i)*2+1]);
                            else
                                if(((double)dcbuf_2d[i*2]<100000.0) &&
                                   ((double)dcbuf_2d[i*2+1]<100000.0))
                                    fprintf(file," %11.5f,%11.5f",
                                            dcbuf_2d[i*2], dcbuf_2d[i*2+1]);
                                else
                                    fprintf(file," %.5e,%.5e",
                                            dcbuf_2d[i*2], dcbuf_2d[i*2+1]);
			    break;
                        case C_SCPL:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    if(((float)fcbuf_2d[(j*bufsize+i)*2]<100000.0)&&((float)fcbuf_2d[(j*bufsize+i)*2+1]<100000.0))
                                        fprintf(file," %11.5f,%11.5f",
                                                fcbuf_2d[(j*bufsize+i)*2],
                                                fcbuf_2d[(j*bufsize+i)*2+1]);
                                    else
                                        fprintf(file," %.5e,%.5e",
                                                fcbuf_2d[(j*bufsize+i)*2],
                                                fcbuf_2d[(j*bufsize+i)*2+1]);
                            else
                                if(((float)fcbuf_2d[i*2]<100000.0) &&
                                   ((float)fcbuf_2d[i*2+1]<100000.0))
                                    fprintf(file," %11.5f,%11.5f",
                                            fcbuf_2d[i*2], fcbuf_2d[i*2+1]);
                                else
                                    fprintf(file," %.5e,%.5e",
                                            fcbuf_2d[i*2], fcbuf_2d[i*2+1]);
                            break;
                       default:
                          pnga_error("ga_print: wrong data type", 0);
                    }
                    
                    fprintf(file,"\n");
                }
                
                lop[0] = hip[0]+1; hip[0] = GA_MIN(lop[0]+bufsize-1, hi[0]);
                
                for(i=0; i<ndim; i++) {
                    if(lop[i] > hi[i]) {
                        if(i == (ndim-1)) {
                            done = 0;
                        } else {
                            lop[i] = lo[i];
                            
                            if((i == 0) || (i == 1)) {
                                hip[i] = GA_MIN(lop[i]+bufsize-1, hi[i]);
                            } else {
                                hip[i] = lo[i];
                            }
                            
                            if(i == 0) {
                                lop[i+1] = hip[i+1]+1;
                                hip[i+1] = GA_MIN(lop[i+1]+bufsize-1, hi[i+1]);
                            } else {
                                lop[i+1]++; hip[i+1]++;
                            }
                            
                            if(i == 0) status_2d = 1;
                            if(i == 1) status_3d = 1;
                        }
                    }
                }
            }
        }
        fflush(file);
    }
    
    pnga_sync();
}